

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  longlong lVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  short sVar44;
  short sVar45;
  short sVar46;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *piVar47;
  undefined8 extraout_RDX;
  int *array;
  undefined4 in_register_00000084;
  ulong uVar49;
  undefined4 in_register_0000008c;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  ulong uVar50;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i alVar51;
  __m128i alVar52;
  int32_t s2Len_00;
  int16_t *piVar53;
  int local_8d0;
  int local_8cc;
  int local_8b8;
  int local_8b4;
  int local_8a0;
  int local_89c;
  int local_888;
  int local_884;
  int local_870;
  int local_86c;
  int local_858;
  int local_854;
  int local_840;
  int local_83c;
  int local_828;
  int local_824;
  int local_7f0;
  int16_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMax;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_5be;
  int iStack_5b8;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  ulong uVar48;
  
  s2B = (int16_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse2_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_sse2_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_sse2_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_sse2_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse2_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse2_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_sse2_128_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_7f0 = _s1Len;
    if (matrix->type != 0) {
      local_7f0 = matrix->length;
    }
    _POS_LIMIT = local_7f0 + -1;
    iStack_5b8 = s2Len + -1;
    N._0_2_ = (short)open;
    sVar44 = (short)N;
    if (matrix->min <= -open) {
      sVar44 = -(short)matrix->min;
    }
    sVar44 = sVar44 + -0x7fff;
    sVar45 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    vSaturationCheckMax[0] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    vSaturationCheckMax[1] = CONCAT26(sVar45,CONCAT24(sVar45,CONCAT22(sVar45,sVar45)));
    vSaturationCheckMin[0] = CONCAT26(sVar45,CONCAT24(sVar45,CONCAT22(sVar45,sVar45)));
    lVar23 = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    uVar50 = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    uVar24 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar25 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (short)gap;
    uVar26 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    uVar27 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    sVar46 = (short)PAD * 8;
    auVar28._2_2_ = sVar46;
    auVar28._0_2_ = sVar46;
    auVar28._4_2_ = sVar46;
    auVar28._6_2_ = sVar46;
    auVar28._10_2_ = sVar46;
    auVar28._8_2_ = sVar46;
    auVar28._12_2_ = sVar46;
    auVar28._14_2_ = sVar46;
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    s2Len_PAD._0_2_ = (undefined2)local_7f0;
    auVar39._2_2_ = (undefined2)s2Len_PAD;
    auVar39._0_2_ = (undefined2)s2Len_PAD;
    auVar39._4_2_ = (undefined2)s2Len_PAD;
    auVar39._6_2_ = (undefined2)s2Len_PAD;
    auVar39._10_2_ = (undefined2)s2Len_PAD;
    auVar39._8_2_ = (undefined2)s2Len_PAD;
    auVar39._12_2_ = (undefined2)s2Len_PAD;
    auVar39._14_2_ = (undefined2)s2Len_PAD;
    auVar38._8_8_ = 0x1000100010001;
    auVar38._0_8_ = 0x1000100010001;
    psubsw(auVar39,auVar38);
    gap_local._0_2_ = (undefined2)s2Len;
    auVar37._2_2_ = (undefined2)gap_local;
    auVar37._0_2_ = (undefined2)gap_local;
    auVar37._4_2_ = (undefined2)gap_local;
    auVar37._6_2_ = (undefined2)gap_local;
    auVar37._10_2_ = (undefined2)gap_local;
    auVar37._8_2_ = (undefined2)gap_local;
    auVar37._12_2_ = (undefined2)gap_local;
    auVar37._14_2_ = (undefined2)gap_local;
    auVar36._8_8_ = 0x1000100010001;
    auVar36._0_8_ = 0x1000100010001;
    psubsw(auVar37,auVar36);
    vIBoundary[0]._6_2_ = -(short)N;
    mask[1] = CONCAT62((int6)(CONCAT44(in_register_0000008c,gap) >> 0x10),
                       vIBoundary[0]._6_2_ - (short)PAD);
    vIBoundary[0]._2_2_ = vIBoundary[0]._6_2_ + (short)PAD * -2;
    uVar49 = CONCAT62((int6)(CONCAT44(in_register_00000084,open) >> 0x10),vIBoundary[0]._2_2_);
    vNH[1]._2_2_ = vIBoundary[0]._6_2_ + (short)PAD * -6;
    vNH[1]._0_2_ = ((short)PAD - (short)(gap << 3)) - (short)N;
    vNH[1]._4_2_ = vIBoundary[0]._6_2_ + (short)PAD * -5;
    vNH[1]._6_2_ = vIBoundary[0]._6_2_ - (short)(gap << 2);
    vIBoundary[0]._0_2_ = vIBoundary[0]._6_2_ + (short)PAD * -3;
    vIBoundary[0]._4_2_ = vIBoundary[0]._6_2_ - (short)PAD;
    _s1_local = (char *)parasail_result_new_table1(local_7f0,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8201001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      alVar51[0] = (size_t)(s2Len + 0xe);
      array = (int *)0x0;
      ptr_01 = parasail_memalign_int16_t(0x10,alVar51[0]);
      piVar47 = ptr + 7;
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          alVar51[0] = (size_t)(local_7f0 + 7);
          array = (int *)0x0;
          s2B = parasail_memalign_int16_t(0x10,alVar51[0]);
          if (s2B == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_7f0; end_query = end_query + 1) {
            s2B[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_7f0; end_query < local_7f0 + 7; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar47[end_ref] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          piVar47[end_ref] = 0;
        }
        while (end_ref = iVar7, end_ref < s2Len + 7) {
          piVar47[end_ref] = 0;
          iVar7 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = -((short)end_ref * (short)PAD) - (short)N;
          ptr_01[(long)end_ref + 7] = sVar44;
        }
        for (end_ref = -7; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = sVar44;
          ptr_01[(long)end_ref + 7] = sVar44;
        }
        while (end_ref = iVar7, end_ref < s2Len + 7) {
          ptr_00[(long)end_ref + 7] = sVar44;
          ptr_01[(long)end_ref + 7] = sVar44;
          iVar7 = end_ref + 1;
        }
        ptr_00[6] = 0;
        vILimit[1] = lVar23;
        vMax[0] = uVar50;
        for (end_query = 0; end_query < local_7f0; end_query = end_query + 8) {
          vNH[0] = uVar50;
          vWH[1] = lVar23;
          vWH[0] = uVar50;
          vE[1] = lVar23;
          vF[0] = uVar50;
          vJ[1] = lVar23;
          vJ[0]._0_6_ = 0xfffffffefffd;
          matrow0 = (int *)0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          piVar15 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_824 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_7f0) {
              local_828 = end_query;
            }
            else {
              local_828 = local_7f0 + -1;
            }
            local_824 = local_828;
          }
          piVar16 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_83c = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_7f0) {
              local_840 = end_query + 1;
            }
            else {
              local_840 = local_7f0 + -1;
            }
            local_83c = local_840;
          }
          piVar17 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_854 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_7f0) {
              local_858 = end_query + 2;
            }
            else {
              local_858 = local_7f0 + -1;
            }
            local_854 = local_858;
          }
          piVar18 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_86c = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_7f0) {
              local_870 = end_query + 3;
            }
            else {
              local_870 = local_7f0 + -1;
            }
            local_86c = local_870;
          }
          piVar19 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_884 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_7f0) {
              local_888 = end_query + 4;
            }
            else {
              local_888 = local_7f0 + -1;
            }
            local_884 = local_888;
          }
          piVar20 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_89c = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_7f0) {
              local_8a0 = end_query + 5;
            }
            else {
              local_8a0 = local_7f0 + -1;
            }
            local_89c = local_8a0;
          }
          piVar21 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_8b4 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_7f0) {
              local_8b8 = end_query + 6;
            }
            else {
              local_8b8 = local_7f0 + -1;
            }
            local_8b4 = local_8b8;
          }
          piVar22 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_8cc = (int)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_7f0) {
              local_8d0 = end_query + 7;
            }
            else {
              local_8d0 = local_7f0 + -1;
            }
            local_8cc = local_8d0;
          }
          vWH[1] = vWH._10_8_;
          vNH[0] = uVar50 >> 0x10;
          vNH[0] = vNH[0] | (ulong)(ushort)ptr_00[6] << 0x30;
          vE[1] = vE._10_8_;
          vWH[0] = uVar50 >> 0x10;
          uVar48 = (ulong)(uint)gap;
          vWH[0] = vWH[0] | (ulong)(ushort)-((short)N + (short)end_query * (short)PAD) << 0x30;
          ptr_00[6] = -(((short)end_query + 8) * (short)PAD) - (short)N;
          vF[1] = lVar23;
          vE[0] = uVar50;
          for (end_ref = 0; auVar37 = stack0xfffffffffffff8f8, auVar36 = stack0xfffffffffffff8c8,
              end_ref < s2Len + 7; end_ref = end_ref + 1) {
            stack0xfffffffffffff8f8 = vE._10_14_;
            vNH[0]._6_2_ = ptr_00[(long)end_ref + 7];
            auVar39 = stack0xfffffffffffff8f8;
            stack0xfffffffffffff8c8 = vJ._10_14_;
            vF[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar38 = stack0xfffffffffffff8c8;
            vWH[1] = vE._10_8_;
            vNH[0] = auVar39._8_8_;
            auVar35._8_8_ = vNH[0];
            auVar35._0_8_ = vWH[1];
            auVar34._8_8_ = uVar25;
            auVar34._0_8_ = uVar24;
            psubsw(auVar35,auVar34);
            vJ[1] = auVar36._2_8_;
            vF[0] = auVar38._8_8_;
            auVar33._8_8_ = vF[0];
            auVar33._0_8_ = vJ[1];
            auVar32._8_8_ = uVar27;
            auVar32._0_8_ = uVar26;
            psubsw(auVar33,auVar32);
            auVar31._8_8_ = uVar25;
            auVar31._0_8_ = uVar24;
            psubsw(stack0xfffffffffffff8e8,auVar31);
            auVar30._8_8_ = vE[0];
            auVar30._0_8_ = vF[1];
            auVar29._8_8_ = uVar27;
            auVar29._0_8_ = uVar26;
            psubsw(auVar30,auVar29);
            uVar1 = (undefined2)piVar16[(long)(iVar8 * local_83c) + (long)piVar47[end_ref + -1]];
            mask[1] = CONCAT62((int6)((ulong)mask[1] >> 0x10),uVar1);
            uVar2 = (undefined2)piVar17[(long)(iVar9 * local_854) + (long)piVar47[end_ref + -2]];
            mask[0] = CONCAT62((int6)(uVar49 >> 0x10),uVar2);
            uVar3 = (undefined2)piVar18[(long)(iVar10 * local_86c) + (long)piVar47[end_ref + -3]];
            alVar52[0] = CONCAT62((int6)((ulong)array >> 0x10),uVar3);
            uVar4 = (undefined2)piVar19[(long)(iVar11 * local_884) + (long)piVar47[end_ref + -4]];
            alVar52[1] = CONCAT62((int6)(alVar51[0] >> 0x10),uVar4);
            uVar5 = (undefined2)piVar20[(long)(iVar12 * local_89c) + (long)piVar47[end_ref + -5]];
            b[0]._2_6_ = (undefined6)(uVar48 >> 0x10);
            b[0]._0_2_ = uVar5;
            uVar6 = (undefined2)piVar21[(long)(iVar13 * local_8b4) + (long)piVar47[end_ref + -6]];
            b[1] = CONCAT62(piVar47[end_ref + -6] >> 0xf,uVar6);
            auVar42._2_2_ = uVar6;
            auVar42._0_2_ = (short)piVar22[(long)(iVar14 * local_8cc) + (long)piVar47[end_ref + -7]]
            ;
            auVar42._4_2_ = uVar5;
            auVar42._6_2_ = uVar4;
            auVar42._10_2_ = uVar2;
            auVar42._8_2_ = uVar3;
            auVar42._12_2_ = uVar1;
            auVar42._14_2_ = (short)piVar15[(long)(iVar7 * local_824) + (long)piVar47[end_ref]];
            paddsw(auVar37,auVar42);
            piVar53 = piVar47;
            alVar51 = _mm_blendv_epi8_rpl(alVar52,b,mask);
            s2Len_00 = (int32_t)piVar53;
            b_00[0] = alVar51[1];
            vWH[0] = extraout_XMM0_Qb;
            vE[1] = extraout_XMM0_Qa;
            a[1] = alVar52[1];
            a[0] = alVar52[0];
            b_00[1] = b[1];
            mask_00[1] = mask[1];
            mask_00[0] = mask[0];
            alVar51 = _mm_blendv_epi8_rpl(a,b_00,mask_00);
            b_01[0] = alVar51[1];
            vF[0] = extraout_XMM0_Qb_00;
            vJ[1] = extraout_XMM0_Qa_00;
            auVar36 = stack0xfffffffffffff8c8;
            a_00[1] = alVar52[1];
            a_00[0] = alVar52[0];
            b_01[1] = b[1];
            mask_01[1] = mask[1];
            mask_01[0] = mask[0];
            _mm_blendv_epi8_rpl(a_00,b_01,mask_01);
            local_e8 = (short)extraout_XMM0_Qa;
            if (7 < end_ref) {
              local_d8 = (short)vSaturationCheckMax[1];
              sStack_d6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_d4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_d2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_d0 = (short)vSaturationCheckMin[0];
              sStack_ce = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_cc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_ca = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              sStack_e6 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
              sStack_e4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
              sStack_e2 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
              sStack_e0 = (short)extraout_XMM0_Qb;
              sStack_de = (short)((ulong)extraout_XMM0_Qb >> 0x10);
              sStack_dc = (short)((ulong)extraout_XMM0_Qb >> 0x20);
              sStack_da = (short)((ulong)extraout_XMM0_Qb >> 0x30);
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(sStack_e2 < sStack_d2) * sStack_e2 |
                            (ushort)(sStack_e2 >= sStack_d2) * sStack_d2,
                            CONCAT24((ushort)(sStack_e4 < sStack_d4) * sStack_e4 |
                                     (ushort)(sStack_e4 >= sStack_d4) * sStack_d4,
                                     CONCAT22((ushort)(sStack_e6 < sStack_d6) * sStack_e6 |
                                              (ushort)(sStack_e6 >= sStack_d6) * sStack_d6,
                                              (ushort)(local_e8 < local_d8) * local_e8 |
                                              (ushort)(local_e8 >= local_d8) * local_d8)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(sStack_da < sStack_ca) * sStack_da |
                            (ushort)(sStack_da >= sStack_ca) * sStack_ca,
                            CONCAT24((ushort)(sStack_dc < sStack_cc) * sStack_dc |
                                     (ushort)(sStack_dc >= sStack_cc) * sStack_cc,
                                     CONCAT22((ushort)(sStack_de < sStack_ce) * sStack_de |
                                              (ushort)(sStack_de >= sStack_ce) * sStack_ce,
                                              (ushort)(sStack_e0 < sStack_d0) * sStack_e0 |
                                              (ushort)(sStack_e0 >= sStack_d0) * sStack_d0)));
              local_238 = (short)vNegInf[1];
              sStack_236 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_234 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_232 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_230 = (short)vSaturationCheckMax[0];
              sStack_22e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_22c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_22a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              vNegInf[1] = CONCAT26((ushort)(sStack_232 < sStack_e2) * sStack_e2 |
                                    (ushort)(sStack_232 >= sStack_e2) * sStack_232,
                                    CONCAT24((ushort)(sStack_234 < sStack_e4) * sStack_e4 |
                                             (ushort)(sStack_234 >= sStack_e4) * sStack_234,
                                             CONCAT22((ushort)(sStack_236 < sStack_e6) * sStack_e6 |
                                                      (ushort)(sStack_236 >= sStack_e6) * sStack_236
                                                      ,(ushort)(local_238 < local_e8) * local_e8 |
                                                       (ushort)(local_238 >= local_e8) * local_238))
                                   );
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)(sStack_22a < sStack_da) * sStack_da |
                            (ushort)(sStack_22a >= sStack_da) * sStack_22a,
                            CONCAT24((ushort)(sStack_22c < sStack_dc) * sStack_dc |
                                     (ushort)(sStack_22c >= sStack_dc) * sStack_22c,
                                     CONCAT22((ushort)(sStack_22e < sStack_de) * sStack_de |
                                              (ushort)(sStack_22e >= sStack_de) * sStack_22e,
                                              (ushort)(sStack_230 < sStack_e0) * sStack_e0 |
                                              (ushort)(sStack_230 >= sStack_e0) * sStack_230)));
            }
            array = ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row;
            alVar51[0] = (size_t)(uint)end_query;
            uVar49 = (ulong)(uint)s2Len;
            alVar51[1]._0_4_ = local_7f0;
            alVar51[1]._4_4_ = 0;
            arr_store_si128(array,alVar51,end_ref,s2Len,(int32_t)mask[1],s2Len_00);
            b_02[0]._2_6_ = (undefined6)((ulong)extraout_RDX >> 0x10);
            ptr_00[(long)(end_ref + -7) + 7] = local_e8;
            vJ[1]._0_2_ = (int16_t)extraout_XMM0_Qa_00;
            b_02[0]._0_2_ = (int16_t)vJ[1];
            b_02[1] = (long)(end_ref + -7);
            ptr_01[b_02[1] + 7] = (int16_t)vJ[1];
            a_01[1] = alVar51[0];
            a_01[0] = (longlong)array;
            mask_02[1] = mask[1];
            mask_02[0] = uVar49;
            alVar52 = _mm_blendv_epi8_rpl(a_01,b_02,mask_02);
            uVar48 = alVar52[1];
            auVar41._8_8_ = 0x1000100010001;
            auVar41._0_8_ = 0x1000100010001;
            _matrow0 = paddsw(_matrow0,auVar41);
            unique0x100029c9 = auVar36;
            vF[1] = extraout_XMM0_Qa_01;
            vE[0] = extraout_XMM0_Qb_01;
            unique0x10002a09 = auVar39;
            vILimit[1] = extraout_XMM0_Qa_02;
            vMax[0] = extraout_XMM0_Qb_02;
          }
          auVar40._8_8_ = 0x8000800080008;
          auVar40._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xfffffffffffff978,auVar40);
          register0x00001200 = psubsw(stack0xfffffffffffff908,auVar28);
        }
        local_5be = sVar44;
        for (end_query = 0; end_query < 8; end_query = end_query + 1) {
          if (local_5be < vMax[0]._6_2_) {
            local_5be = vMax[0]._6_2_;
          }
          vMax[0] = vMax[0] << 0x10 | (ulong)vILimit[1] >> 0x30;
          vILimit[1] = vILimit[1] << 0x10;
        }
        local_58 = (short)vSaturationCheckMax[1];
        sStack_56 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_54 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_52 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_50 = (short)vSaturationCheckMin[0];
        sStack_4e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_4c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_4a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_28 = (short)vNegInf[1];
        sStack_26 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_24 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_22 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_20 = (short)vSaturationCheckMax[0];
        sStack_1e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_1c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_1a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar50 = CONCAT26(-(ushort)(sStack_4a < sVar44),
                          CONCAT24(-(ushort)(sStack_4c < sVar44),
                                   CONCAT22(-(ushort)(sStack_4e < sVar44),
                                            -(ushort)(sStack_50 < sVar44)))) |
                 CONCAT26(-(ushort)(sVar45 < sStack_1a),
                          CONCAT24(-(ushort)(sVar45 < sStack_1c),
                                   CONCAT22(-(ushort)(sVar45 < sStack_1e),
                                            -(ushort)(sVar45 < sStack_20))));
        auVar43._8_8_ = uVar50;
        auVar43._0_8_ =
             CONCAT26(-(ushort)(sStack_52 < sVar44),
                      CONCAT24(-(ushort)(sStack_54 < sVar44),
                               CONCAT22(-(ushort)(sStack_56 < sVar44),-(ushort)(local_58 < sVar44)))
                     ) |
             CONCAT26(-(ushort)(sVar45 < sStack_22),
                      CONCAT24(-(ushort)(sVar45 < sStack_24),
                               CONCAT22(-(ushort)(sVar45 < sStack_26),-(ushort)(sVar45 < local_28)))
                     );
        if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar43 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar50 >> 7 & 1) != 0) || (uVar50 >> 0xf & 1) != 0) || (uVar50 >> 0x17 & 1) != 0)
               || (uVar50 >> 0x1f & 1) != 0) || (uVar50 >> 0x27 & 1) != 0) ||
             (uVar50 >> 0x2f & 1) != 0) || (uVar50 >> 0x37 & 1) != 0) || (long)uVar50 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_5be = 0;
          _POS_LIMIT = 0;
          iStack_5b8 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)local_5be;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = iStack_5b8;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}